

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.hh
# Opt level: O3

integer_t * __thiscall tchecker::vm_t::slot_of(vm_t *this,bytecode_t id)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  out_of_range *this_00;
  pointer pmVar3;
  _Base_ptr p_Var4;
  
  pmVar3 = (this->_frames).
           super__Vector_base<std::map<long,_int,_std::less<long>,_std::allocator<std::pair<const_long,_int>_>_>,_std::allocator<std::map<long,_int,_std::less<long>,_std::allocator<std::pair<const_long,_int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (pmVar3 == (this->_frames).
                  super__Vector_base<std::map<long,_int,_std::less<long>,_std::allocator<std::pair<const_long,_int>_>_>,_std::allocator<std::map<long,_int,_std::less<long>,_std::allocator<std::pair<const_long,_int>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
      this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
      std::out_of_range::out_of_range(this_00,"unknown local variable ID");
      __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
    }
    p_Var4 = pmVar3[-1]._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    if (p_Var4 != (_Base_ptr)0x0) {
      p_Var1 = &pmVar3[-1]._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = &p_Var1->_M_header;
      do {
        if (id <= *(long *)(p_Var4 + 1)) {
          p_Var2 = p_Var4;
        }
        p_Var4 = (&p_Var4->_M_left)[*(long *)(p_Var4 + 1) < id];
      } while (p_Var4 != (_Base_ptr)0x0);
      if (((_Rb_tree_header *)p_Var2 != p_Var1) && (*(long *)(p_Var2 + 1) <= id)) {
        return (integer_t *)&p_Var2[1]._M_parent;
      }
    }
    pmVar3 = pmVar3 + -1;
  } while( true );
}

Assistant:

tchecker::integer_t & slot_of(tchecker::bytecode_t id)
  {
    for (auto it = _frames.rbegin(); it != _frames.rend(); ++it) {
      auto kv = it->find(id);
      if (kv != it->end())
        return kv->second;
    }
    throw std::out_of_range("unknown local variable ID");
  }